

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
duckdb::InternalException::InternalException<char,unsigned_long,unsigned_long>
          (InternalException *this,string *msg,char params,unsigned_long params_1,
          unsigned_long params_2)

{
  undefined7 in_register_00000011;
  unsigned_long in_R9;
  string local_30;
  
  Exception::ConstructMessage<char,unsigned_long,unsigned_long>
            (&local_30,(Exception *)msg,(string *)CONCAT71(in_register_00000011,params),
             (char)params_1,params_2,in_R9);
  InternalException(this,(string *)&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

explicit InternalException(const string &msg, ARGS... params)
	    : InternalException(ConstructMessage(msg, params...)) {
	}